

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classmetadata.cpp
# Opt level: O3

bool __thiscall stackjit::ClassMetadata::makeVirtualFunctionTable(ClassMetadata *this)

{
  ClassType *this_00;
  pointer pcVar1;
  ulong uVar2;
  _Rb_tree_color _Var3;
  ClassMetadata *pCVar4;
  mapped_type *pmVar5;
  _Base_ptr p_Var6;
  string *psVar7;
  FunctionDefinition *function;
  const_iterator cVar8;
  BytePtr *ppuVar9;
  ulong uVar10;
  mapped_type *pmVar11;
  bool bVar12;
  _Rb_tree_color _Var13;
  _Rb_tree_header *p_Var14;
  __hashtable *__h_1;
  pointer ppFVar15;
  __node_base _Var16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  __hashtable *__h;
  string rootSignature;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  virtualFuncMapping;
  undefined1 local_f0 [8];
  _Alloc_hider local_e8;
  undefined1 local_e0 [8];
  char local_d8 [16];
  pointer local_c8;
  key_type local_c0;
  _Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
  *local_a0;
  ClassMetadata *local_98;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_90;
  key_type local_88;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  if (this->mVirtualFunctionTable == (BytePtr *)0x0) {
    local_c8 = (this->mVirtualFunctions).
               super__Vector_base<const_stackjit::FunctionDefinition_*,_std::allocator<const_stackjit::FunctionDefinition_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    this_00 = this->mParentClass;
    ppFVar15 = (this->mVirtualFunctions).
               super__Vector_base<const_stackjit::FunctionDefinition_*,_std::allocator<const_stackjit::FunctionDefinition_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    _Var13 = _S_red;
    bVar12 = false;
    if (local_c8 != ppFVar15 || this_00 != (ClassType *)0x0) {
      local_68._M_buckets = &local_68._M_single_bucket;
      local_68._M_bucket_count = 1;
      local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_68._M_element_count = 0;
      local_68._M_rehash_policy._M_max_load_factor = 1.0;
      local_68._M_rehash_policy._M_next_resize = 0;
      local_68._M_single_bucket = (__node_base_ptr)0x0;
      if (this_00 != (ClassType *)0x0) {
        pCVar4 = ClassType::metadata(this_00);
        makeVirtualFunctionTable(pCVar4);
        pCVar4 = ClassType::metadata(this->mParentClass);
        p_Var6 = (pCVar4->mIndexToVirtualFunction)._M_t._M_impl.super__Rb_tree_header._M_header.
                 _M_left;
        p_Var14 = &(pCVar4->mIndexToVirtualFunction)._M_t._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)p_Var6 == p_Var14) {
          _Var13 = _S_red;
        }
        else {
          local_a0 = (_Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
                      *)&this->mIndexToVirtualFunction;
          local_90 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&this->mVirtualFunctionToIndex;
          local_c8 = (pointer)((ulong)local_c8 & 0xffffffff00000000);
          local_98 = this;
          do {
            local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_c0,p_Var6[1]._M_parent,
                       (long)&(p_Var6[1]._M_parent)->_M_color + (long)&(p_Var6[1]._M_left)->_M_color
                      );
            _Var13 = p_Var6[1]._M_color;
            local_f0._0_4_ = _Var13;
            local_e8._M_p = local_d8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_e8,local_c0._M_dataplus._M_p,
                       local_c0._M_dataplus._M_p + local_c0._M_string_length);
            std::
            _Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
            ::_M_insert_unique<std::pair<int_const,std::__cxx11::string>>
                      (local_a0,(pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)local_f0);
            if (local_e8._M_p != local_d8) {
              operator_delete(local_e8._M_p);
            }
            local_f0 = (undefined1  [8])local_e0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_f0,local_c0._M_dataplus._M_p,
                       local_c0._M_dataplus._M_p + local_c0._M_string_length);
            local_d8._8_4_ = _Var13;
            std::
            _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_M_emplace<std::pair<std::__cxx11::string_const,int>>(local_90,(string *)local_f0);
            if (local_f0 != (undefined1  [8])local_e0) {
              operator_delete((void *)local_f0);
            }
            pmVar5 = std::__detail::
                     _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)&local_68,&local_c0);
            std::__cxx11::string::_M_assign((string *)pmVar5);
            _Var3 = (_Rb_tree_color)local_c8;
            if ((int)(_Rb_tree_color)local_c8 <= (int)_Var13) {
              _Var3 = _Var13;
            }
            local_c8 = (pointer)CONCAT44(local_c8._4_4_,_Var3);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
              operator_delete(local_c0._M_dataplus._M_p);
            }
            p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
          } while ((_Rb_tree_header *)p_Var6 != p_Var14);
          _Var13 = (_Rb_tree_color)local_c8 + _S_black;
          this = local_98;
        }
        ppFVar15 = (this->mVirtualFunctions).
                   super__Vector_base<const_stackjit::FunctionDefinition_*,_std::allocator<const_stackjit::FunctionDefinition_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        local_c8 = (this->mVirtualFunctions).
                   super__Vector_base<const_stackjit::FunctionDefinition_*,_std::allocator<const_stackjit::FunctionDefinition_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      }
      if (ppFVar15 != local_c8) {
        local_a0 = (_Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
                    *)&this->mIndexToVirtualFunction;
        do {
          FunctionSignature::from((FunctionSignature *)local_f0,*ppFVar15);
          psVar7 = FunctionSignature::str_abi_cxx11_((FunctionSignature *)local_f0);
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          pcVar1 = (psVar7->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_c0,pcVar1,pcVar1 + psVar7->_M_string_length);
          if (local_f0 != (undefined1  [8])local_e0) {
            operator_delete((void *)local_f0);
          }
          function = getVirtualFunctionRootDefinition(this,*ppFVar15);
          FunctionSignature::from((FunctionSignature *)local_f0,function);
          psVar7 = FunctionSignature::str_abi_cxx11_((FunctionSignature *)local_f0);
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
          pcVar1 = (psVar7->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_88,pcVar1,pcVar1 + psVar7->_M_string_length);
          if (local_f0 != (undefined1  [8])local_e0) {
            operator_delete((void *)local_f0);
          }
          cVar8 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(&(this->mVirtualFunctionToIndex)._M_h,&local_88);
          if (cVar8.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
              ._M_cur == (__node_type *)0x0) {
            local_f0._0_4_ = _Var13;
            local_e8._M_p = local_d8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_e8,local_c0._M_dataplus._M_p,
                       local_c0._M_dataplus._M_p + local_c0._M_string_length);
            std::
            _Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
            ::_M_insert_unique<std::pair<int_const,std::__cxx11::string>>
                      (local_a0,(pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)local_f0);
            if (local_e8._M_p != local_d8) {
              operator_delete(local_e8._M_p);
            }
            local_f0 = (undefined1  [8])local_e0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_f0,local_c0._M_dataplus._M_p,
                       local_c0._M_dataplus._M_p + local_c0._M_string_length);
            local_d8._8_4_ = _Var13;
            std::
            _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_M_emplace<std::pair<std::__cxx11::string_const,int>>
                      ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)&this->mVirtualFunctionToIndex,
                       (pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_f0);
            if (local_f0 != (undefined1  [8])local_e0) {
              operator_delete((void *)local_f0);
            }
            _Var13 = _Var13 + _S_black;
          }
          pmVar5 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&local_68,&local_88);
          std::__cxx11::string::_M_assign((string *)pmVar5);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p);
          }
          ppFVar15 = ppFVar15 + 1;
        } while (ppFVar15 != local_c8);
      }
      uVar2 = (this->mIndexToVirtualFunction)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      ppuVar9 = (BytePtr *)operator_new__(-(ulong)(uVar2 >> 0x3d != 0) | uVar2 * 8);
      this->mVirtualFunctionTable = ppuVar9;
      if (uVar2 != 0) {
        uVar10 = 0;
        do {
          this->mVirtualFunctionTable[uVar10] = (BytePtr)0x0;
          uVar10 = uVar10 + 1;
        } while (uVar2 != uVar10);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize(&this->mVirtualFunctionMapping,local_68._M_element_count);
      if (local_68._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
        _Var16._M_nxt = local_68._M_before_begin._M_nxt;
        do {
          pmVar11 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&this->mVirtualFunctionToIndex,(key_type *)(_Var16._M_nxt + 1));
          std::__cxx11::string::_M_assign
                    ((string *)
                     ((this->mVirtualFunctionMapping).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + *pmVar11));
          _Var16._M_nxt = (_Var16._M_nxt)->_M_nxt;
        } while (_Var16._M_nxt != (_Hash_node_base *)0x0);
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_68);
      bVar12 = true;
    }
  }
  else {
    bVar12 = false;
  }
  return bVar12;
}

Assistant:

bool ClassMetadata::makeVirtualFunctionTable() {
		if (mVirtualFunctionTable == nullptr && (mVirtualFunctions.size() > 0 || mParentClass != nullptr)) {
			int virtualFuncIndex = 0;
			bool hasParentVirtual = false;
			std::unordered_map<std::string, std::string> virtualFuncMapping;

			//Create for parent class
			if (mParentClass != nullptr) {
				mParentClass->metadata()->makeVirtualFunctionTable();

				//Add the parent class virtual functions
				for (auto& virtualFunc : mParentClass->metadata()->mIndexToVirtualFunction) {
					auto name = virtualFunc.second;
					auto index = virtualFunc.first;
					mIndexToVirtualFunction.insert({ index, name });
					mVirtualFunctionToIndex.insert({ name, index });
					virtualFuncMapping[name] = name;
					virtualFuncIndex = std::max(virtualFuncIndex, index);
					hasParentVirtual = true;
				}
			}

			if (hasParentVirtual) {
				virtualFuncIndex++;
			}

			//Now for this class
			for (auto& virtualFunc : mVirtualFunctions) {
				auto signature = FunctionSignature::from(*virtualFunc).str();
				auto rootDef = getVirtualFunctionRootDefinition(virtualFunc);
				auto rootSignature = FunctionSignature::from(*rootDef).str();

				if (mVirtualFunctionToIndex.count(rootSignature) == 0) {
					mIndexToVirtualFunction.insert({ virtualFuncIndex, signature });
					mVirtualFunctionToIndex.insert({ signature, virtualFuncIndex });
					virtualFuncIndex++;
				}

				virtualFuncMapping[rootSignature] = signature;
			}

			//Create the actual table. Note that these functions are bound when compiled.
			mVirtualFunctionTable = new BytePtr[mIndexToVirtualFunction.size()];
			for (std::size_t i = 0; i < mIndexToVirtualFunction.size(); i++) {
				mVirtualFunctionTable[i] = nullptr;
			}

			//Create the final mapping
			mVirtualFunctionMapping.resize(virtualFuncMapping.size());
			for (auto& virtualFunc : virtualFuncMapping) {
				mVirtualFunctionMapping[mVirtualFunctionToIndex[virtualFunc.first]] = virtualFunc.second;
			}

			return true;
		}

		return false;
	}